

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qitemdelegate.cpp
# Opt level: O0

QString * qPixmapSerial(quint64 i,bool enabled)

{
  byte in_DL;
  ulong in_RSI;
  QString *in_RDI;
  long in_FS_OFFSET;
  ushort *ptr;
  ushort arr [18];
  QChar *local_58;
  ulong local_48;
  undefined1 local_38 [30];
  undefined2 local_1a;
  undefined2 local_18;
  short local_16;
  undefined1 auStack_14 [12];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  memset(local_38,0xaa,0x24);
  memset(local_38,0,0x24);
  local_18 = 0x2d;
  local_16 = (in_DL & 1) + 0x30;
  local_58 = (QChar *)&local_18;
  for (local_48 = in_RSI; local_48 != 0; local_48 = local_48 >> 4) {
    *(ushort *)(local_58 + -2) = ((ushort)local_48 & 0xf) + 0x30;
    local_58 = local_58 + -2;
  }
  QString::QString(in_RDI,local_58,(long)(int)((ulong)(auStack_14 + -(long)local_58) >> 1));
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

static QString qPixmapSerial(quint64 i, bool enabled)
{
    ushort arr[] = { 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, '-', ushort('0' + enabled) };
    ushort *ptr = &arr[16];

    while (i > 0) {
        // hey - it's our internal representation, so use the ascii character after '9'
        // instead of 'a' for hex
        *(--ptr) = '0' + i % 16;
        i >>= 4;
    }

    return QString((const QChar *)ptr, int(&arr[sizeof(arr) / sizeof(ushort)] - ptr));
}